

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QTabBarPrivate::Tab_*>::reallocateAndGrow
          (QArrayDataPointer<QTabBarPrivate::Tab_*> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QTabBarPrivate::Tab_*> *old)

{
  long lVar1;
  bool bVar2;
  QPodArrayOps<QTabBarPrivate::Tab_*> *this_00;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  QArrayDataPointer<QTabBarPrivate::Tab_*> *in_RDI;
  long in_FS_OFFSET;
  qsizetype toCopy;
  QArrayDataPointer<QTabBarPrivate::Tab_*> dp;
  undefined4 in_stack_ffffffffffffff78;
  AllocationOption in_stack_ffffffffffffff7c;
  QArrayDataPointer<QTabBarPrivate::Tab_*> *in_stack_ffffffffffffff80;
  QArrayDataPointer<QTabBarPrivate::Tab_*> *in_stack_ffffffffffffff88;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((in_ESI != 0) || (in_RCX != 0)) || (bVar2 = needsDetach(in_stack_ffffffffffffff80), bVar2))
     || (in_RDX < 1)) {
    allocateGrow((QArrayDataPointer<QTabBarPrivate::Tab_*> *)&DAT_aaaaaaaaaaaaaaaa,
                 -0x5555555555555556,0xaaaaaaaa);
    if (0 < in_RDX) {
      qt_noop();
    }
    if (in_RDI->size != 0) {
      bVar2 = needsDetach(in_stack_ffffffffffffff80);
      if ((bVar2) || (in_RCX != 0)) {
        this_00 = (QPodArrayOps<QTabBarPrivate::Tab_*> *)
                  operator->((QArrayDataPointer<QTabBarPrivate::Tab_*> *)&stack0xffffffffffffffe0);
        begin((QArrayDataPointer<QTabBarPrivate::Tab_*> *)0x6ba25c);
        begin((QArrayDataPointer<QTabBarPrivate::Tab_*> *)0x6ba26b);
        QtPrivate::QPodArrayOps<QTabBarPrivate::Tab_*>::copyAppend
                  (this_00,(Tab **)in_stack_ffffffffffffff88,(Tab **)in_stack_ffffffffffffff80);
      }
      else {
        in_stack_ffffffffffffff80 =
             (QArrayDataPointer<QTabBarPrivate::Tab_*> *)
             operator->((QArrayDataPointer<QTabBarPrivate::Tab_*> *)&stack0xffffffffffffffe0);
        begin((QArrayDataPointer<QTabBarPrivate::Tab_*> *)0x6ba2a4);
        begin((QArrayDataPointer<QTabBarPrivate::Tab_*> *)0x6ba2b3);
        QtPrivate::QPodArrayOps<QTabBarPrivate::Tab_*>::moveAppend
                  ((QPodArrayOps<QTabBarPrivate::Tab_*> *)in_stack_ffffffffffffff80,
                   (Tab **)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                   (Tab **)0x6ba2d1);
      }
    }
    swap(in_stack_ffffffffffffff80,
         (QArrayDataPointer<QTabBarPrivate::Tab_*> *)
         CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    if (in_RCX != 0) {
      swap(in_stack_ffffffffffffff80,
           (QArrayDataPointer<QTabBarPrivate::Tab_*> *)
           CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    }
    ~QArrayDataPointer(in_stack_ffffffffffffff80);
  }
  else {
    operator->(in_RDI);
    constAllocatedCapacity(in_stack_ffffffffffffff80);
    freeSpaceAtEnd(in_stack_ffffffffffffff88);
    QtPrivate::QPodArrayOps<QTabBarPrivate::Tab_*>::reallocate
              ((QPodArrayOps<QTabBarPrivate::Tab_*> *)in_stack_ffffffffffffff88,
               (qsizetype)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }